

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

ProgramContext * __thiscall
deqp::gles3::Performance::InvalidShaderCompilerMandelbrotCase::generateShaderSources
          (ProgramContext *__return_storage_ptr__,InvalidShaderCompilerMandelbrotCase *this,
          int measurementNdx)

{
  uint uVar1;
  InvalidityType IVar2;
  size_type sVar3;
  pointer __dest;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int numFractalIterations;
  uint uVar4;
  ShaderValidity validity;
  size_type __dnew;
  string local_80;
  InvalidShaderCompilerMandelbrotCase *local_60;
  size_type local_58;
  string local_50;
  
  uVar1 = ((uint)measurementNdx >> 0x10 ^ measurementNdx ^ 0x3d) * 9;
  uVar4 = (uVar1 >> 4 ^ uVar1) * 0x27d4eb2d;
  uVar1 = (this->super_InvalidShaderCompilerCase).m_startHash;
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  IVar2 = (this->super_InvalidShaderCompilerCase).m_invalidityType;
  validity = SHADER_VALIDITY_INVALID_CHAR;
  if (IVar2 != INVALIDITY_INVALID_CHAR) {
    validity = IVar2 == INVALIDITY_SEMANTIC_ERROR ^ SHADER_VALIDITY_LAST;
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_58 = 0x20e;
  local_60 = this;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_58);
  sVar3 = local_58;
  uVar4 = uVar4 >> 0xf ^ uVar1 ^ uVar4;
  local_80.field_2._M_allocated_capacity = local_58;
  local_80._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 300 es\nuniform highp mat4 u_mvp${NAME_SPEC};\n\nin highp vec4 a_vertex${NAME_SPEC};\nin highp vec4 a_coord${NAME_SPEC};\n\nout mediump vec2 v_coord${NAME_SPEC};\n\nvoid main(void)\n{\n\tgl_Position = u_mvp${NAME_SPEC} * a_vertex${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\n\tfloat xMin = -2.0;\n\tfloat xMax = +0.5;\n\tfloat yMin = -1.5;\n\tfloat yMax = +1.5;\n\n\tv_coord${NAME_SPEC}.x = a_coord${NAME_SPEC}.x * (xMax - xMin) + xMin;\n\tv_coord${NAME_SPEC}.y = a_coord${NAME_SPEC}.y * (yMax - yMin) + yMin;\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
         ,0x20e);
  local_80._M_string_length = sVar3;
  __dest[sVar3] = '\0';
  specializeShaderSource(&local_50,&local_80,uVar4,validity);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  numFractalIterations = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    numFractalIterations = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    numFractalIterations = extraout_EDX_01;
  }
  mandelbrotFragmentTemplate_abi_cxx11_
            (&local_80,(Performance *)(ulong)(uint)local_60->m_numFractalIterations,
             numFractalIterations);
  specializeShaderSource(&local_50,&local_80,uVar4,validity);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

InvalidShaderCompilerCase::ProgramContext InvalidShaderCompilerMandelbrotCase::generateShaderSources (int measurementNdx) const
{
	deUint32		specID			= getSpecializationID(measurementNdx);
	ProgramContext	result;
	ShaderValidity	shaderValidity	= m_invalidityType == INVALIDITY_INVALID_CHAR	? SHADER_VALIDITY_INVALID_CHAR
									: m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
									: SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	result.vertShaderSource = specializeShaderSource(mandelbrotVertexTemplate(), specID, shaderValidity);
	result.fragShaderSource = specializeShaderSource(mandelbrotFragmentTemplate(m_numFractalIterations), specID, shaderValidity);

	return result;
}